

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int ly_set_merge(ly_set *trg,ly_set *src,int options)

{
  uint uVar1;
  lys_node **pplVar2;
  ulong uVar3;
  char *format;
  LY_ERR no;
  ulong uVar4;
  
  if (trg == (ly_set *)0x0) {
    format = "Invalid arguments (%s()).";
    no = LY_EINVAL;
LAB_0016f5b5:
    ly_log((ly_ctx *)0x0,LY_LLERR,no,format,"ly_set_merge");
    uVar1 = 0xffffffff;
  }
  else {
    if (src == (ly_set *)0x0) {
      return 0;
    }
    if (((options & 1U) == 0) && (src->number != 0)) {
      uVar4 = 0;
      do {
        if ((ulong)trg->number == 0) {
LAB_0016f530:
          uVar4 = (ulong)((uint)uVar4 + 1);
        }
        else {
          uVar3 = 0;
          do {
            if ((trg->set).s[uVar3] == (src->set).s[uVar4]) goto LAB_0016f51f;
            uVar3 = uVar3 + 1;
          } while (trg->number != uVar3);
          uVar3 = 0xffffffff;
LAB_0016f51f:
          if ((int)uVar3 < 0) goto LAB_0016f530;
          ly_set_rm_index(src,(uint)uVar4);
        }
      } while ((uint)uVar4 < src->number);
    }
    uVar1 = src->number + trg->number;
    if (trg->size < uVar1) {
      pplVar2 = (lys_node **)realloc((trg->set).s,(ulong)uVar1 << 3);
      if (pplVar2 == (lys_node **)0x0) {
        format = "Memory allocation failed (%s()).";
        no = LY_EMEM;
        goto LAB_0016f5b5;
      }
      trg->size = src->number + trg->number;
      (trg->set).s = pplVar2;
    }
    memcpy((trg->set).s + trg->number,(src->set).s,(ulong)src->number << 3);
    uVar1 = src->number;
    trg->number = trg->number + uVar1;
    free((src->set).s);
    free(src);
  }
  return uVar1;
}

Assistant:

API int
ly_set_merge(struct ly_set *trg, struct ly_set *src, int options)
{
    unsigned int i, ret;
    void **new;

    if (!trg) {
        LOGARG;
        return -1;
    }

    if (!src) {
        return 0;
    }

    if (!(options & LY_SET_OPT_USEASLIST)) {
        /* remove duplicates */
        i = 0;
        while (i < src->number) {
            if (ly_set_contains(trg, src->set.g[i]) > -1) {
                ly_set_rm_index(src, i);
            } else {
                ++i;
            }
        }
    }

    /* allocate more memory if needed */
    if (trg->size < trg->number + src->number) {
        new = realloc(trg->set.g, (trg->number + src->number) * sizeof *(trg->set.g));
        LY_CHECK_ERR_RETURN(!new, LOGMEM(NULL), -1);
        trg->size = trg->number + src->number;
        trg->set.g = new;
    }

    /* copy contents from src into trg */
    memcpy(trg->set.g + trg->number, src->set.g, src->number * sizeof *(src->set.g));
    ret = src->number;
    trg->number += ret;

    /* cleanup */
    ly_set_free(src);
    return ret;
}